

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

string * __thiscall
cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGenerator *this)

{
  cmExternalMakefileProjectGenerator *pcVar1;
  _Alloc_hider _Var2;
  
  pcVar1 = (this->ExtraGenerator)._M_t.
           super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
           .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl;
  if (pcVar1 == (cmExternalMakefileProjectGenerator *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    _Var2._M_p = (pcVar1->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,_Var2._M_p,
               _Var2._M_p + (pcVar1->Name)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GetExtraGeneratorName() const
{
  return this->ExtraGenerator ? this->ExtraGenerator->GetName()
                              : std::string();
}